

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_stats(void **param_1)

{
  roaring64_statistics_t stats;
  uint32_t i_1;
  uint32_t i;
  roaring64_bitmap_t *r1;
  undefined8 in_stack_ffffffffffffff78;
  int line;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  roaring64_bitmap_t *in_stack_ffffffffffffff90;
  undefined8 local_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  line = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  roaring64_bitmap_create();
  _assert_true((unsigned_long)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,line);
  for (local_14 = 100; local_14 < 1000; local_14 = local_14 + 1) {
    roaring64_bitmap_add(in_stack_ffffffffffffff90,(uint64_t)in_stack_ffffffffffffff88);
  }
  for (local_18 = 1000; local_18 < 100000; local_18 = local_18 + 10) {
    roaring64_bitmap_add(in_stack_ffffffffffffff90,(uint64_t)in_stack_ffffffffffffff88);
  }
  roaring64_bitmap_add(in_stack_ffffffffffffff90,(uint64_t)in_stack_ffffffffffffff88);
  roaring64_bitmap_statistics
            ((roaring64_bitmap_t *)stats.n_bytes_array_containers,
             (roaring64_statistics_t *)stats.n_values_bitset_containers);
  roaring64_bitmap_get_cardinality((roaring64_bitmap_t *)stats.n_bitset_containers);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff90,
                    (unsigned_long)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,uStack_1c);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff90,
                    (unsigned_long)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,uStack_1c);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff90,
                    (unsigned_long)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,uStack_1c);
  roaring64_bitmap_free((roaring64_bitmap_t *)stats.n_array_containers);
  return;
}

Assistant:

DEFINE_TEST(test_stats) {
    // create a new empty bitmap
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    assert_non_null(r1);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        roaring64_bitmap_add(r1, i);
    }
    for (uint32_t i = 1000; i < 100000; i += 10) {
        roaring64_bitmap_add(r1, i);
    }
    roaring64_bitmap_add(r1, 100000);

    roaring64_statistics_t stats;
    roaring64_bitmap_statistics(r1, &stats);
    assert_int_equal(stats.cardinality, roaring64_bitmap_get_cardinality(r1));
    assert_int_equal(stats.min_value, 100);
    assert_int_equal(stats.max_value, 100000);
    roaring64_bitmap_free(r1);
}